

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpagesetupdialog_unix.cpp
# Opt level: O1

void __thiscall QPageSetupWidget::initPageSizes(QPageSetupWidget *this)

{
  QDoubleSpinBox *pQVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  QPlatformPrinterSupport *pQVar5;
  long lVar6;
  PageSizeId PVar7;
  QPageSize *pageSize;
  undefined8 uVar8;
  long in_FS_OFFSET;
  QPageSize defaultSize;
  QPageSize pageSize_1;
  anon_union_24_3_e3d07ef4_for_data local_b0;
  anon_union_24_3_e3d07ef4_for_data local_98;
  undefined1 local_80 [8];
  QPrintDevice local_78;
  QIcon local_60 [8];
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 *)&this[1].super_Ui_QPageSetupWidget.horizontalSpacer_3 = 1;
  QComboBox::clear();
  *(undefined4 *)((long)&this[1].super_Ui_QPageSetupWidget.horizontalSpacer_3 + 4) = 0xffffffff;
  if ((*(int *)&this[1].super_Ui_QPageSetupWidget.heightLabel == 0) &&
     (this[1].super_Ui_QPageSetupWidget.paperSource != (QComboBox *)0x0)) {
    pQVar5 = QPlatformPrinterSupportPlugin::get();
    if (pQVar5 != (QPlatformPrinterSupport *)0x0) {
      local_78.d.value.ptr = (QPlatformPrintDevice *)0xaaaaaaaaaaaaaaaa;
      local_78.d.d._0_4_ = 0xaaaaaaaa;
      local_78.d.d._4_4_ = 0xaaaaaaaa;
      (*pQVar5->_vptr_QPlatformPrinterSupport[4])
                (&local_78,pQVar5,&this[1].super_Ui_QPageSetupWidget.pageHeight);
      local_80 = (undefined1  [8])0xaaaaaaaaaaaaaaaa;
      QPrintDevice::defaultPageSize((QPrintDevice *)local_80);
      local_98._16_8_ = -0x5555555555555556;
      local_98.shared = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
      local_98._8_8_ = (void *)0xaaaaaaaaaaaaaaaa;
      QPrintDevice::supportedPageSizes((QList<QPageSize> *)&local_98,&local_78);
      if (local_98._16_8_ != 0) {
        lVar6 = local_98._16_8_ << 3;
        uVar8 = local_98._8_8_;
        do {
          pQVar1 = (this->super_Ui_QPageSetupWidget).pageHeight;
          QPageSize::name();
          QVariant::QVariant((QVariant *)&local_58,(QMetaType)0x16a078,(void *)uVar8);
          uVar3 = QComboBox::count();
          QIcon::QIcon(local_60);
          QComboBox::insertItem
                    ((int)pQVar1,(QIcon *)(ulong)uVar3,(QString *)local_60,(QVariant *)&local_b0);
          QIcon::~QIcon(local_60);
          QVariant::~QVariant((QVariant *)&local_58);
          if ((QArrayData *)local_b0.shared != (QArrayData *)0x0) {
            LOCK();
            *(int *)local_b0.shared = *(int *)local_b0.shared + -1;
            UNLOCK();
            if (*(int *)local_b0.shared == 0) {
              QArrayData::deallocate((QArrayData *)local_b0.shared,2,0x10);
            }
          }
          uVar8 = uVar8 + 8;
          lVar6 = lVar6 + -8;
        } while (lVar6 != 0);
      }
      iVar4 = QComboBox::count();
      if (0 < iVar4) {
        bVar2 = QPrintDevice::supportsCustomPageSizes(&local_78);
        if (bVar2) {
          pQVar1 = (this->super_Ui_QPageSetupWidget).pageHeight;
          QMetaObject::tr((char *)local_b0.data,(char *)&staticMetaObject,0x1574fb);
          local_58.shared = (PrivateShared *)0x0;
          local_58._8_8_ = 0;
          local_58._16_8_ = 0;
          local_40 = 2;
          uVar3 = QComboBox::count();
          QIcon::QIcon(local_60);
          QComboBox::insertItem
                    ((int)pQVar1,(QIcon *)(ulong)uVar3,(QString *)local_60,(QVariant *)&local_b0);
          QIcon::~QIcon(local_60);
          QVariant::~QVariant((QVariant *)&local_58);
          if ((QArrayData *)local_b0.shared != (QArrayData *)0x0) {
            LOCK();
            *(int *)local_b0.shared = *(int *)local_b0.shared + -1;
            UNLOCK();
            if (*(int *)local_b0.shared == 0) {
              QArrayData::deallocate((QArrayData *)local_b0.shared,2,0x10);
            }
          }
          iVar4 = QComboBox::count();
          *(int *)((long)&this[1].super_Ui_QPageSetupWidget.horizontalSpacer_3 + 4) = iVar4 + -1;
        }
        *(undefined1 *)&this[1].super_Ui_QPageSetupWidget.horizontalSpacer_3 = 0;
        QComboBox::setCurrentIndex((int)(this->super_Ui_QPageSetupWidget).pageHeight);
        pQVar1 = (this->super_Ui_QPageSetupWidget).pageHeight;
        QVariant::QVariant((QVariant *)&local_58,(QMetaType)0x16a078,(QPageSize *)local_80);
        QComboBox::findData(pQVar1,&local_58,0x100,0x10);
        QComboBox::setCurrentIndex((int)pQVar1);
        QVariant::~QVariant((QVariant *)&local_58);
        QArrayDataPointer<QPageSize>::~QArrayDataPointer((QArrayDataPointer<QPageSize> *)&local_98);
        QPageSize::~QPageSize((QPageSize *)local_80);
        QPrintDevice::~QPrintDevice(&local_78);
        goto LAB_00140c71;
      }
      QArrayDataPointer<QPageSize>::~QArrayDataPointer((QArrayDataPointer<QPageSize> *)&local_98);
      QPageSize::~QPageSize((QPageSize *)local_80);
      QPrintDevice::~QPrintDevice(&local_78);
    }
  }
  PVar7 = AnsiA;
  do {
    if (PVar7 == Custom) {
      pQVar1 = (this->super_Ui_QPageSetupWidget).pageHeight;
      QMetaObject::tr((char *)local_98.data,(char *)&staticMetaObject,0x1574fb);
      local_58.shared = (PrivateShared *)0x0;
      local_58._8_8_ = 0;
      local_58._16_8_ = 0;
      local_40 = 2;
      uVar3 = QComboBox::count();
      QIcon::QIcon((QIcon *)local_b0.data);
      QComboBox::insertItem
                ((int)pQVar1,(QIcon *)(ulong)uVar3,(QString *)&local_b0,(QVariant *)&local_98);
      QIcon::~QIcon((QIcon *)local_b0.data);
      QVariant::~QVariant((QVariant *)&local_58);
      if ((QArrayData *)local_98.shared != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_98.shared = *(int *)local_98.shared + -1;
        UNLOCK();
        if (*(int *)local_98.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_98.shared,2,0x10);
        }
      }
      iVar4 = QComboBox::count();
      *(int *)((long)&this[1].super_Ui_QPageSetupWidget.horizontalSpacer_3 + 4) = iVar4 + -1;
    }
    else {
      local_78.d.value.ptr = (QPlatformPrintDevice *)0xaaaaaaaaaaaaaaaa;
      QPageSize::QPageSize((QPageSize *)&local_78,PVar7);
      pQVar1 = (this->super_Ui_QPageSetupWidget).pageHeight;
      QPageSize::name();
      QVariant::QVariant((QVariant *)&local_58,(QMetaType)0x16a078,(QPageSize *)&local_78);
      uVar3 = QComboBox::count();
      QIcon::QIcon((QIcon *)local_b0.data);
      QComboBox::insertItem
                ((int)pQVar1,(QIcon *)(ulong)uVar3,(QString *)&local_b0,(QVariant *)&local_98);
      QIcon::~QIcon((QIcon *)local_b0.data);
      QVariant::~QVariant((QVariant *)&local_58);
      if ((QArrayData *)local_98.shared != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_98.shared = *(int *)local_98.shared + -1;
        UNLOCK();
        if (*(int *)local_98.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_98.shared,2,0x10);
        }
      }
      QPageSize::~QPageSize((QPageSize *)&local_78);
    }
    PVar7 = PVar7 + Legal;
  } while (PVar7 != EnvelopeYou4);
  *(undefined1 *)&this[1].super_Ui_QPageSetupWidget.horizontalSpacer_3 = 0;
LAB_00140c71:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPageSetupWidget::initPageSizes()
{
    m_blockSignals = true;

    m_ui.pageSizeCombo->clear();

    m_realCustomPageSizeIndex = -1;

    if (m_outputFormat == QPrinter::NativeFormat && !m_printerName.isEmpty()) {
        QPlatformPrinterSupport *ps = QPlatformPrinterSupportPlugin::get();
        if (ps) {
            QPrintDevice printDevice = ps->createPrintDevice(m_printerName);
            const QPageSize defaultSize = printDevice.defaultPageSize();
            const auto pageSizes = printDevice.supportedPageSizes();
            for (const QPageSize &pageSize : pageSizes)
                m_ui.pageSizeCombo->addItem(pageSize.name(), QVariant::fromValue(pageSize));
            if (m_ui.pageSizeCombo->count() > 0) {
                if (printDevice.supportsCustomPageSizes()) {
                    m_ui.pageSizeCombo->addItem(tr("Custom"));
                    m_realCustomPageSizeIndex = m_ui.pageSizeCombo->count() - 1;
                }
                m_blockSignals = false;

                // If the defaultSize is index 0, setCurrentIndex won't emit the currentIndexChanged
                // signal; workaround the issue by initially setting the currentIndex to -1
                m_ui.pageSizeCombo->setCurrentIndex(-1);
                m_ui.pageSizeCombo->setCurrentIndex(m_ui.pageSizeCombo->findData(QVariant::fromValue(defaultSize)));
                return;
            }
        }
    }

    // If PdfFormat or no available printer page sizes, populate with all page sizes
    for (int id = 0; id < QPageSize::LastPageSize; ++id) {
        if (QPageSize::PageSizeId(id) == QPageSize::Custom) {
            m_ui.pageSizeCombo->addItem(tr("Custom"));
            m_realCustomPageSizeIndex = m_ui.pageSizeCombo->count() - 1;
        } else {
            QPageSize pageSize = QPageSize(QPageSize::PageSizeId(id));
            m_ui.pageSizeCombo->addItem(pageSize.name(), QVariant::fromValue(pageSize));
        }
    }

    m_blockSignals = false;
}